

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O0

void __thiscall QPropertyAnimation::QPropertyAnimation(QPropertyAnimation *this,QObject *parent)

{
  QVariantAnimationPrivate *dd;
  QObject *in_RDI;
  QPropertyAnimationPrivate *in_stack_ffffffffffffffe0;
  
  dd = (QVariantAnimationPrivate *)operator_new(0x188);
  QPropertyAnimationPrivate::QPropertyAnimationPrivate(in_stack_ffffffffffffffe0);
  QVariantAnimation::QVariantAnimation((QVariantAnimation *)in_stack_ffffffffffffffe0,dd,in_RDI);
  in_RDI->_vptr_QObject = (_func_int **)&PTR_metaObject_00be9d48;
  return;
}

Assistant:

QPropertyAnimation::QPropertyAnimation(QObject *parent)
    : QVariantAnimation(*new QPropertyAnimationPrivate, parent)
{
}